

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsByFrequency
          (MidiMessage *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping,
          int program)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  int local_50;
  int i;
  allocator<std::pair<int,_double>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> semimap;
  int program_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping_local;
  MidiMessage *this_local;
  
  semimap.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = program;
  sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    (mapping);
  std::allocator<std::pair<int,_double>_>::allocator(&local_39);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_38,
             sVar2,&local_39);
  std::allocator<std::pair<int,_double>_>::~allocator(&local_39);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      (mapping);
    if ((int)sVar2 <= local_50) break;
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](mapping,(long)local_50);
    iVar1 = pvVar3->first;
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        local_38,(long)local_50);
    pvVar3->first = iVar1;
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](mapping,(long)local_50);
    dVar4 = frequencyToSemitones(pvVar3->second,440.0);
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        local_38,(long)local_50);
    pvVar3->second = dVar4;
    local_50 = local_50 + 1;
  }
  makeMts2_KeyTuningsBySemitone
            (this,(vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  local_38,
             semimap.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_38);
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsByFrequency(std::vector<std::pair<int, double>>& mapping, int program) {
	std::vector<std::pair<int, double>> semimap(mapping.size());
	for (int i=0; i<(int)mapping.size(); i++) {
		semimap[i].first = mapping[i].first;
		semimap[i].second = MidiMessage::frequencyToSemitones(mapping[i].second);
	}
	this->makeMts2_KeyTuningsBySemitone(semimap, program);
}